

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_init_dist(uint32_t seed)

{
  uint32_t uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  llama_sampler *plVar2;
  undefined4 in_EDI;
  uint32_t seed_cur;
  uint32_t in_stack_00002710;
  llama_sampler_context_t in_stack_ffffffffffffffd8;
  
  uVar1 = get_rng_seed(in_stack_00002710);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(0x1390);
  *(undefined4 *)this->_M_x = in_EDI;
  *(uint32_t *)((long)this->_M_x + 4) = uVar1;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this,(result_type)in_stack_ffffffffffffffd8);
  plVar2 = llama_sampler_init((llama_sampler_i *)this,in_stack_ffffffffffffffd8);
  return plVar2;
}

Assistant:

struct llama_sampler * llama_sampler_init_dist(uint32_t seed) {
    auto seed_cur = get_rng_seed(seed);
    return llama_sampler_init(
        /* .iface = */ &llama_sampler_dist_i,
        /* .ctx   = */ new llama_sampler_dist {
            /* .seed     = */ seed,
            /* .seed_cur = */ seed_cur,
            /* .rng      = */ std::mt19937(seed_cur),
        }
    );
}